

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O3

ZyanStatus
ZydisFormatterBasePrintAddressABS
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanU8 ZVar1;
  ZyanStatus ZVar2;
  ZydisPadding ZVar3;
  ZyanU64 address;
  ulong local_28;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xe2,
                  "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xe3,
                  "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xe4,
                  "ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar2 = ZydisCalcAbsoluteAddress
                    (context->instruction,context->operand,context->runtime_address,&local_28);
  if (-1 < (int)ZVar2) {
    ZVar3 = formatter->addr_padding_absolute;
    if (ZVar3 == ZYDIS_PADDING_AUTO) {
      if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
        ZVar1 = context->instruction->address_width;
        if (ZVar1 == '@') {
          ZVar3 = 0x10;
        }
        else if (ZVar1 == ' ') {
          local_28 = local_28 & 0xffffffff;
          ZVar3 = 8;
        }
        else {
          if (ZVar1 != '\x10') {
            return 0x80100004;
          }
          local_28 = local_28 & 0xffff;
          ZVar3 = 4;
        }
      }
      else {
        ZVar3 = ZYDIS_PADDING_DISABLED;
      }
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar2 = ZydisFormatterBufferAppend(buffer,'\b'), (int)ZVar2 < 0)) {
      return ZVar2;
    }
    if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar2 = ZydisStringAppendHexU
                        (&buffer->string,local_28,(ZyanU8)ZVar3,formatter->hex_force_leading_number,
                         formatter->hex_uppercase,formatter->number_format[1][0].string,
                         formatter->number_format[1][1].string);
    }
    else {
      if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
        return 0x80100004;
      }
      ZVar2 = ZydisStringAppendDecU
                        (&buffer->string,local_28,(ZyanU8)ZVar3,
                         formatter->number_format[0][0].string,formatter->number_format[0][1].string
                        );
    }
    if (-1 < (int)ZVar2) {
      ZVar2 = 0x100000;
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintAddressABS(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZyanU64 address;
    ZYAN_CHECK(ZydisCalcAbsoluteAddress(context->instruction, context->operand,
        context->runtime_address, &address));
    ZyanU8 padding = (formatter->addr_padding_absolute ==
        ZYDIS_PADDING_AUTO) ? 0 : (ZyanU8)formatter->addr_padding_absolute;
    if ((formatter->addr_padding_absolute == ZYDIS_PADDING_AUTO) &&
        (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX))
    {
        switch (context->instruction->address_width)
        {
        case 16:
            padding =  4;
            address = (ZyanU16)address;
            break;
        case 32:
            padding =  8;
            address = (ZyanU32)address;
            break;
        case 64:
            padding = 16;
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_ADDRESS_ABS);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string, address, padding,
        formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}